

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TTSupport.h
# Opt level: O0

byte * __thiscall
TTD::SlabAllocatorBase<8>::SlabAllocateRawSize<true,true>
          (SlabAllocatorBase<8> *this,size_t requestedBytes)

{
  long *plVar1;
  uint uVar2;
  uint32 desiredsize;
  byte *res;
  size_t requestedBytes_local;
  SlabAllocatorBase<8> *this_local;
  
  if (requestedBytes == 0) {
    TTDAbort_unrecoverable_error("Don\'t allocate empty arrays.");
  }
  if (0x1000 < requestedBytes) {
    TTDAbort_unrecoverable_error("Don\'t allocate large requests in the bump pool.");
  }
  uVar2 = (int)requestedBytes + 0xbU & 0xfffffffc;
  if ((ulong)uVar2 < requestedBytes + 8 || (ulong)this->m_slabBlockSize - 0x20 <= (ulong)uVar2) {
    TTDAbort_unrecoverable_error("We can never allocate a block this big with the slab allocator!!")
    ;
  }
  if (this->m_reserveActiveBytes != 0) {
    TTDAbort_unrecoverable_error("Don\'t double allocate memory.");
  }
  if (this->m_endPos < this->m_currPos + uVar2) {
    AddNewBlock(this);
  }
  plVar1 = (long *)this->m_currPos;
  *plVar1 = (long)plVar1 - (long)this->m_headBlock;
  this->m_currPos = this->m_currPos + uVar2;
  this->m_totalAllocatedSize = (ulong)uVar2 + this->m_totalAllocatedSize;
  this->m_headBlock->RefCounter = this->m_headBlock->RefCounter + 1;
  return (byte *)(plVar1 + 1);
}

Assistant:

byte* SlabAllocateRawSize(size_t requestedBytes)
        {
            TTDAssert(requestedBytes != 0, "Don't allocate empty arrays.");
            TTDAssert(requestedBytes <= TTD_SLAB_LARGE_BLOCK_SIZE, "Don't allocate large requests in the bump pool.");

            byte* res = nullptr;
            uint32 desiredsize = TTD_WORD_ALIGN_ALLOC_SIZE(requestedBytes + canUnlink); //make alloc size word aligned
            TTDAssert((desiredsize % 4 == 0) & (desiredsize >= (requestedBytes + canUnlink)) & (desiredsize < TTD_SLAB_BLOCK_USABLE_SIZE(this->m_slabBlockSize)), "We can never allocate a block this big with the slab allocator!!");

            if (reserve)
            {
                TTDAssert(this->m_reserveActiveBytes == 0, "Don't double allocate memory.");

                if (this->m_currPos + desiredsize > this->m_endPos)
                {
                    this->AddNewBlock();
                }

                res = this->m_currPos;

                if (canUnlink)
                {
                    TTDAssert(canUnlink == sizeof(ptrdiff_t), "We need enough space for a ptr to the meta-data.");

                    //record the block associated with this allocation
                    *((ptrdiff_t*)res) = res - ((byte*)this->m_headBlock);

                    res += canUnlink;
                }
            }

            if (commit)
            {
                this->m_currPos += desiredsize;

#if ENABLE_TTD_INTERNAL_DIAGNOSTICS
                this->m_totalAllocatedSize += desiredsize;
#endif

                if (canUnlink)
                {
                    this->m_headBlock->RefCounter++;
                }
            }

            if (reserve && !commit)
            {
                this->m_reserveActiveBytes = desiredsize;
            }

            if (!reserve && commit)
            {
                TTDAssert(desiredsize <= this->m_reserveActiveBytes, "We are commiting more that we reserved.");

                this->m_reserveActiveBytes = 0;
            }

            return res;
        }